

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O0

BasePropHandleT<std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
 __thiscall
OpenMesh::PropertyContainer::
add<std::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
          (PropertyContainer *this,
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *param_2,string *_name)

{
  bool bVar1;
  reference ppBVar2;
  string *_name_00;
  reference ppBVar3;
  long in_RDI;
  int idx;
  iterator p_end;
  iterator p_it;
  vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
  *in_stack_ffffffffffffff98;
  uint7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  int local_34;
  __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
  local_28 [4];
  BaseHandle local_4;
  
  local_28[0]._M_current =
       (BaseProperty **)
       std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::begin
                 (in_stack_ffffffffffffff98);
  std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::end
            (in_stack_ffffffffffffff98);
  local_34 = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       (__normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                        *)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa7 = false;
    if (bVar1) {
      ppBVar2 = __gnu_cxx::
                __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                ::operator*(local_28);
      in_stack_ffffffffffffffa7 = *ppBVar2 != (BaseProperty *)0x0;
    }
    if ((bool)in_stack_ffffffffffffffa7 == false) break;
    __gnu_cxx::
    __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
    ::operator++(local_28);
    local_34 = local_34 + 1;
  }
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                      *)(ulong)in_stack_ffffffffffffffa0,
                     (__normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                      *)in_stack_ffffffffffffff98);
  if (bVar1) {
    std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::push_back
              ((vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (value_type *)in_stack_ffffffffffffff98);
  }
  _name_00 = (string *)operator_new(0x48);
  PropertyT<std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::PropertyT((PropertyT<std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),_name_00);
  ppBVar3 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
            operator[]((vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                        *)(in_RDI + 8),(long)local_34);
  *ppBVar3 = (value_type)_name_00;
  BasePropHandleT<std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::BasePropHandleT((BasePropHandleT<std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    (int)((ulong)_name_00 >> 0x20));
  return (BaseHandle)(BaseHandle)local_4.idx_;
}

Assistant:

BasePropHandleT<T> add(const T&, const std::string& _name="<unknown>")
  {
    Properties::iterator p_it=properties_.begin(), p_end=properties_.end();
    int idx=0;
    for ( ; p_it!=p_end && *p_it!=NULL; ++p_it, ++idx ) {};
    if (p_it==p_end) properties_.push_back(NULL);
    properties_[idx] = new PropertyT<T>(_name);
    return BasePropHandleT<T>(idx);
  }